

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHPrivateKey.cpp
# Opt level: O2

bool __thiscall DHPrivateKey::deserialise(DHPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dX;
  ByteString dG;
  ByteString dP;
  ByteString local_90;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  ByteString::chainDeserialise(&local_90,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&local_90);
      if (sVar1 != 0) {
        (**(code **)(*(long *)this + 0x48))(this,&local_40);
        (**(code **)(*(long *)this + 0x50))(this,&local_68);
        bVar2 = true;
        (**(code **)(*(long *)this + 0x40))(this,&local_90);
        goto LAB_0012b7cb;
      }
    }
  }
  bVar2 = false;
LAB_0012b7cb:
  ByteString::~ByteString(&local_90);
  ByteString::~ByteString(&local_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool DHPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dX = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dG.size() == 0) ||
	    (dX.size() == 0))
	{
		return false;
	}

	setP(dP);
	setG(dG);
	setX(dX);

	return true;
}